

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          EnumValueDescriptor *value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int value_00;
  int iVar4;
  Descriptor *pDVar5;
  EnumDescriptor *pEVar6;
  EnumDescriptor *pEVar7;
  ExtensionSet *this_00;
  EnumValueDescriptor *value_local;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedEnum",CPPTYPE_ENUM);
  }
  pEVar6 = EnumValueDescriptor::type(value);
  pEVar7 = FieldDescriptor::enum_type(field);
  if (pEVar6 != pEVar7) {
    anon_unknown_0::ReportReflectionUsageEnumTypeError
              (this->descriptor_,field,"SetRepeatedEnum",value);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    iVar4 = FieldDescriptor::number(field);
    value_00 = EnumValueDescriptor::number(value);
    ExtensionSet::SetRepeatedEnum(this_00,iVar4,index,value_00);
  }
  else {
    iVar4 = EnumValueDescriptor::number(value);
    SetRepeatedField<int>(this,message,field,index,iVar4);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedEnum(
    Message* message,
    const FieldDescriptor* field, int index,
    const EnumValueDescriptor* value) const {
  USAGE_CHECK_ALL(SetRepeatedEnum, REPEATED, ENUM);
  USAGE_CHECK_ENUM_VALUE(SetRepeatedEnum);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(
      field->number(), index, value->number());
  } else {
    SetRepeatedField<int>(message, field, index, value->number());
  }
}